

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

pointer __thiscall
slang::
SmallVectorBase<std::unique_ptr<slang::parsing::Lexer,std::default_delete<slang::parsing::Lexer>>>::
emplaceRealloc<std::unique_ptr<slang::parsing::Lexer,std::default_delete<slang::parsing::Lexer>>>
          (SmallVectorBase<std::unique_ptr<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_>_>
           *this,pointer pos,
          unique_ptr<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_> *args)

{
  size_type sVar1;
  size_type sVar2;
  size_type sVar3;
  iterator puVar4;
  long lVar5;
  pointer puVar6;
  EVP_PKEY_CTX *ctx;
  iterator in_RSI;
  SmallVectorBase<std::unique_ptr<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_>_>
  *in_RDI;
  pointer newPos;
  pointer newData;
  size_type offset;
  size_type newCap;
  unique_ptr<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_>
  *in_stack_ffffffffffffff98;
  unique_ptr<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_>
  *in_stack_ffffffffffffffa0;
  iterator __last;
  size_type in_stack_ffffffffffffffb0;
  
  sVar1 = in_RDI->len;
  sVar2 = SmallVectorBase<std::unique_ptr<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_>_>
          ::max_size((SmallVectorBase<std::unique_ptr<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_>_>
                      *)0x367b2b);
  if (sVar1 == sVar2) {
    detail::throwLengthError();
  }
  sVar3 = SmallVectorBase<std::unique_ptr<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_>_>
          ::calculateGrowth(in_RDI,in_stack_ffffffffffffffb0);
  __last = in_RSI;
  puVar4 = SmallVectorBase<std::unique_ptr<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_>_>
           ::begin(in_RDI);
  lVar5 = (long)__last - (long)puVar4;
  puVar6 = (pointer)operator_new(0x367b8a);
  std::unique_ptr<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_>::unique_ptr
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  puVar4 = SmallVectorBase<std::unique_ptr<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_>_>
           ::end(in_RDI);
  if (in_RSI == puVar4) {
    puVar4 = SmallVectorBase<std::unique_ptr<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_>_>
             ::begin(in_RDI);
    ctx = (EVP_PKEY_CTX *)
          SmallVectorBase<std::unique_ptr<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_>_>
          ::end(in_RDI);
    std::
    uninitialized_move<std::unique_ptr<slang::parsing::Lexer,std::default_delete<slang::parsing::Lexer>>*,std::unique_ptr<slang::parsing::Lexer,std::default_delete<slang::parsing::Lexer>>*>
              (in_RSI,__last,puVar4);
  }
  else {
    SmallVectorBase<std::unique_ptr<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_>_>
    ::begin(in_RDI);
    std::
    uninitialized_move<std::unique_ptr<slang::parsing::Lexer,std::default_delete<slang::parsing::Lexer>>*,std::unique_ptr<slang::parsing::Lexer,std::default_delete<slang::parsing::Lexer>>*>
              (in_RSI,__last,in_stack_ffffffffffffffa0);
    ctx = (EVP_PKEY_CTX *)
          SmallVectorBase<std::unique_ptr<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_>_>
          ::end(in_RDI);
    std::
    uninitialized_move<std::unique_ptr<slang::parsing::Lexer,std::default_delete<slang::parsing::Lexer>>*,std::unique_ptr<slang::parsing::Lexer,std::default_delete<slang::parsing::Lexer>>*>
              (in_RSI,__last,in_stack_ffffffffffffffa0);
  }
  SmallVectorBase<std::unique_ptr<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_>_>
  ::cleanup(in_RDI,ctx);
  in_RDI->len = in_RDI->len + 1;
  in_RDI->cap = sVar3;
  in_RDI->data_ = puVar6;
  return puVar6 + (lVar5 >> 3);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}